

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

QMessageBoxPrivate * __thiscall
QMessageBoxPrivate::standardIcon(QMessageBoxPrivate *this,Icon icon,QMessageBox *mb)

{
  char cVar1;
  undefined4 uVar2;
  QStyle *pQVar3;
  long lVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  double dVar6;
  QIcon tmpIcon;
  QIcon local_50;
  QIcon local_48;
  QIcon local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (mb == (QMessageBox *)0x0) {
    pQVar3 = QApplication::style();
  }
  else {
    pQVar3 = QWidget::style((QWidget *)mb);
  }
  uVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x47,0,mb);
  local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_48);
  switch(icon) {
  case Information:
    lVar4 = *(long *)pQVar3;
    uVar5 = 9;
    break;
  case Warning:
    lVar4 = *(long *)pQVar3;
    uVar5 = 10;
    break;
  case Critical:
    lVar4 = *(long *)pQVar3;
    uVar5 = 0xb;
    break;
  case Question:
    lVar4 = *(long *)pQVar3;
    uVar5 = 0xc;
    break;
  default:
    goto switchD_0050c8cc_default;
  }
  (**(code **)(lVar4 + 0x100))(&local_50,pQVar3,uVar5,0,mb);
  local_40.d = local_48.d;
  local_48.d = local_50.d;
  local_50.d = (QIconPrivate *)0x0;
  QIcon::~QIcon(&local_40);
  QIcon::~QIcon(&local_50);
switchD_0050c8cc_default:
  cVar1 = QIcon::isNull();
  if (cVar1 == '\0') {
    if (mb == (QMessageBox *)0x0) {
      dVar6 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar6 = (double)QPaintDevice::devicePixelRatio();
    }
    local_40.d._4_4_ = uVar2;
    local_40.d._0_4_ = uVar2;
    QIcon::pixmap((QSize *)this,dVar6,(Mode)&local_48,(State)&local_40);
  }
  else {
    QPixmap::QPixmap((QPixmap *)this);
  }
  QIcon::~QIcon(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QPixmap QMessageBoxPrivate::standardIcon(QMessageBox::Icon icon, QMessageBox *mb)
{
    QStyle *style = mb ? mb->style() : QApplication::style();
    int iconSize = style->pixelMetric(QStyle::PM_MessageBoxIconSize, nullptr, mb);
    QIcon tmpIcon;
    switch (icon) {
    case QMessageBox::Information:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxInformation, nullptr, mb);
        break;
    case QMessageBox::Warning:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxWarning, nullptr, mb);
        break;
    case QMessageBox::Critical:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxCritical, nullptr, mb);
        break;
    case QMessageBox::Question:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxQuestion, nullptr, mb);
        break;
    default:
        break;
    }
    if (!tmpIcon.isNull()) {
        qreal dpr = mb ? mb->devicePixelRatio() : qApp->devicePixelRatio();
        return tmpIcon.pixmap(QSize(iconSize, iconSize), dpr);
    }
    return QPixmap();
}